

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O0

int h262_gop(bitstream *str,h262_gop *gop)

{
  int iVar1;
  undefined8 in_RSI;
  uint32_t *in_RDI;
  int size;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  size = (int)((ulong)in_RSI >> 0x20);
  iVar1 = vs_u((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               size);
  if (iVar1 == 0) {
    iVar1 = vs_u((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 size);
    if (iVar1 == 0) {
      iVar1 = vs_u((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                   ,size);
      if (iVar1 == 0) {
        iVar1 = vs_mark((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
        if (iVar1 == 0) {
          iVar1 = vs_u((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,size);
          if (iVar1 == 0) {
            iVar1 = vs_u((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,size);
            if (iVar1 == 0) {
              iVar1 = vs_u((bitstream *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,size
                          );
              if (iVar1 == 0) {
                iVar1 = vs_u((bitstream *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             size);
                if (iVar1 == 0) {
                  iVar1 = 0;
                }
                else {
                  iVar1 = 1;
                }
              }
              else {
                iVar1 = 1;
              }
            }
            else {
              iVar1 = 1;
            }
          }
          else {
            iVar1 = 1;
          }
        }
        else {
          iVar1 = 1;
        }
      }
      else {
        iVar1 = 1;
      }
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int h262_gop(struct bitstream *str, struct h262_gop *gop) {
	if (vs_u(str, &gop->drop_frame_flag, 1)) return 1;
	if (vs_u(str, &gop->time_code_hours, 5)) return 1;
	if (vs_u(str, &gop->time_code_minutes, 6)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &gop->time_code_seconds, 6)) return 1;
	if (vs_u(str, &gop->time_code_pictures, 6)) return 1;
	if (vs_u(str, &gop->closed_gop, 1)) return 1;
	if (vs_u(str, &gop->broken_link, 1)) return 1;
	return 0;
}